

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

BasicBrokerInfo * __thiscall
helics::CoreBroker::getBrokerById(CoreBroker *this,GlobalBrokerId brokerid)

{
  pointer pBVar1;
  __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  _Var2;
  __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  _Var3;
  GlobalBrokerId GVar4;
  GlobalBrokerId brokerid_local;
  
  if ((this->super_BrokerBase).field_0x294 == '\x01') {
    GVar4.gid = brokerid.gid + 0x90000000;
    if (brokerid.gid < 0x70000000) {
      GVar4.gid = brokerid.gid;
    }
    if ((GVar4.gid < 0) ||
       (pBVar1 = (this->mBrokers).dataStorage.
                 super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (int)(((long)(this->mBrokers).dataStorage.
                    super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x58) <= GVar4.gid)
       ) {
      _Var3._M_current = (BasicBrokerInfo *)0x0;
    }
    else {
      _Var3._M_current = pBVar1 + (uint)GVar4.gid;
    }
  }
  else {
    brokerid_local = brokerid;
    _Var2 = gmlc::containers::
            DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
            ::find(&this->mBrokers,&brokerid_local);
    _Var3._M_current = (BasicBrokerInfo *)0x0;
    if (_Var2._M_current !=
        (this->mBrokers).dataStorage.
        super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      _Var3 = _Var2;
    }
  }
  return _Var3._M_current;
}

Assistant:

const BasicBrokerInfo* CoreBroker::getBrokerById(GlobalBrokerId brokerid) const
{
    if (isRootc) {
        auto brkNum = brokerid.localIndex();
        return (isValidIndex(brkNum, mBrokers)) ? &mBrokers[brkNum] : nullptr;
    }

    auto fnd = mBrokers.find(brokerid);
    return (fnd != mBrokers.end()) ? &(*fnd) : nullptr;
}